

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.hpp
# Opt level: O1

int32_t __thiscall Script::add_or_find_model(Script *this,string_view *name)

{
  const_iterator __position;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  _Var1;
  iterator iVar2;
  int32_t iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  unsigned_long local_38;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,int>const*,std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>>,__gnu_cxx::__ops::_Iter_pred<Script::find_model(libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>const&)const::_lambda(auto:1_const&)_1_>>
                    ((this->models).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->models).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,name);
  if (_Var1._M_current ==
      (this->models).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __position._M_current =
         (this->models).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,name->__data,name->__data + name->__size);
    local_38 = ((long)(this->models).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->models).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    iVar2 = std::
            vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
            ::_M_emplace_aux<std::__cxx11::string,unsigned_long>
                      ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                        *)&this->models,__position,&local_58,&local_38);
    iVar3 = (iVar2._M_current)->second;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    iVar3 = (_Var1._M_current)->second;
  }
  return iVar3;
}

Assistant:

int32_t add_or_find_model(const string_view& name)
    {
        if(auto opt = this->find_model(name))
            return *opt;
        return this->models.emplace(models.end(), name.to_string(), models.size())->second;
    }